

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_q.cpp
# Opt level: O0

void consumer(int c_num)

{
  int local_40;
  int local_3c;
  int i;
  int temp;
  longlong local_30;
  longlong tid;
  __int_type local_20;
  int c_num_local;
  undefined4 local_18;
  undefined4 local_14;
  atomic<int> *local_10;
  
  tid._4_4_ = c_num;
  _i = std::this_thread::get_id();
  local_30 = tid_to_ll((id *)&i);
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] [tid:%lld] %d elements should be consumed\n","info","consumer",0x2a,
           local_30,(ulong)tid._4_4_);
  }
  for (local_40 = 0; local_40 < (int)tid._4_4_; local_40 = local_40 + 1) {
    buffer_queue<int>::pop(&g_q,&local_3c);
    if (1 < pr_level) {
      printf("[%-5s][%s:%d] ---[tid:%lld] consumed no.%d element\n","info","consumer",0x2f,local_30,
             (ulong)(local_40 + 1));
    }
    local_10 = &g_c_cnt;
    local_14 = 1;
    local_18 = 5;
    c_num_local = 1;
    LOCK();
    local_20 = (__int_type)g_c_cnt.super___atomic_base<int>._M_i;
    UNLOCK();
    g_c_cnt.super___atomic_base<int>._M_i =
         (__atomic_base<int>)(__atomic_base<int>)(g_c_cnt.super___atomic_base<int>._M_i + 1)._M_i;
  }
  return;
}

Assistant:

void consumer(int c_num)
{
    long long tid = tid_to_ll(this_thread::get_id());
    PR_INFO("[tid:%lld] %d elements should be consumed\n", tid, c_num);
    int temp;
    for(int i=0; i<c_num; i++)
    {
        g_q.pop(temp);
        PR_INFO("---[tid:%lld] consumed no.%d element\n", tid, i+1);
        g_c_cnt.fetch_add(1);
    }
}